

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arraySlice.c
# Opt level: O0

sysbvm_tuple_t sysbvm_arraySlice_asArray(sysbvm_context_t *context,sysbvm_tuple_t arraySlice)

{
  _Bool _Var1;
  sysbvm_size_t sVar2;
  sysbvm_size_t slotCount;
  sysbvm_tuple_t sVar3;
  ulong local_50;
  size_t i;
  sysbvm_tuple_t *destination;
  sysbvm_tuple_t result;
  size_t size;
  size_t offset;
  sysbvm_arraySlice_t *arraySliceObject;
  sysbvm_tuple_t arraySlice_local;
  sysbvm_context_t *context_local;
  
  _Var1 = sysbvm_tuple_isNonNullPointer(arraySlice);
  if (_Var1) {
    sVar2 = sysbvm_tuple_size_decode(*(sysbvm_tuple_t *)(arraySlice + 0x18));
    slotCount = sysbvm_tuple_size_decode(*(sysbvm_tuple_t *)(arraySlice + 0x20));
    context_local = (sysbvm_context_t *)sysbvm_array_create(context,slotCount);
    for (local_50 = 0; local_50 < slotCount; local_50 = local_50 + 1) {
      sVar3 = sysbvm_arrayOrByteArray_at(*(sysbvm_tuple_t *)(arraySlice + 0x10),sVar2 + local_50);
      *(sysbvm_tuple_t *)(&(context_local->heap).shouldAttemptToCollect + local_50 * 8) = sVar3;
    }
  }
  else {
    context_local = (sysbvm_context_t *)0x0;
  }
  return (sysbvm_tuple_t)context_local;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_arraySlice_asArray(sysbvm_context_t *context, sysbvm_tuple_t arraySlice)
{
   if(!sysbvm_tuple_isNonNullPointer(arraySlice)) return SYSBVM_NULL_TUPLE;

    sysbvm_arraySlice_t *arraySliceObject = (sysbvm_arraySlice_t*)arraySlice;
    size_t offset = sysbvm_tuple_size_decode(arraySliceObject->offset);
    size_t size = sysbvm_tuple_size_decode(arraySliceObject->size);

    sysbvm_tuple_t result = sysbvm_array_create(context, size);
    sysbvm_tuple_t *destination = SYSBVM_CAST_OOP_TO_OBJECT_TUPLE(result)->pointers;
    for(size_t i = 0; i < size; ++i)
        destination[i] = sysbvm_arrayOrByteArray_at(arraySliceObject->elements, offset + i);
    return result;
}